

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O0

bool webfront::http::Headers::caseInsensitiveEqual(string_view s1,string_view s2)

{
  size_type sVar1;
  size_type sVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  const_iterator pvVar5;
  bool local_22;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
  local_22 = false;
  if (sVar1 == sVar2) {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_10);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end(&local_10);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_20);
    local_22 = ::std::
               equal<char_const*,char_const*,webfront::http::Headers::caseInsensitiveEqual(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::_lambda(char,char)_1_>
                         (pvVar3,pvVar4,pvVar5);
  }
  return local_22;
}

Assistant:

[[nodiscard]] static constexpr bool caseInsensitiveEqual(std::string_view s1, std::string_view s2) {
        return ((s1.size() == s2.size()) && std::equal(s1.begin(), s1.end(), s2.begin(), [](char c1, char c2) {
                    return (c1 == c2 || std::toupper(c1) == std::toupper(c2));
                }));
    }